

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acquisition.c
# Opt level: O2

void handle_current_frame_finished(katherine_acquisition_t *acq,uint64_t *data)

{
  int iVar1;
  time_t tVar2;
  
  tVar2 = time((time_t *)0x0);
  (acq->current_frame_info).end_time_observed = tVar2;
  flush_buffer(acq);
  (acq->current_frame_info).sent_pixels = *data & 0xfffffffffff;
  (*(acq->handlers).frame_ended)(acq->user_ctx,acq->completed_frames,true,&acq->current_frame_info);
  iVar1 = acq->completed_frames + 1;
  acq->completed_frames = iVar1;
  if (iVar1 == acq->requested_frames) {
    acq->state = '\x02';
  }
  return;
}

Assistant:

static inline void
handle_current_frame_finished(katherine_acquisition_t *acq, const uint64_t *data)
{
    acq->current_frame_info.end_time_observed = time(NULL);

    flush_buffer(acq);

    acq->current_frame_info.sent_pixels = EXTRACT(*data, md_frame_finished, n_sent);
    acq->handlers.frame_ended(acq->user_ctx, acq->completed_frames, true, &acq->current_frame_info);

    ++acq->completed_frames;

    if (acq->completed_frames == acq->requested_frames) {
        acq->state = ACQUISITION_SUCCEEDED;
    }
}